

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O2

typed_value<std::vector<char,_std::allocator<char>_>,_char> * __thiscall
VW::config::options_boost_po::add_notifier<char>
          (options_boost_po *this,
          shared_ptr<VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>_> *opt,
          typed_value<std::vector<char,_std::allocator<char>_>,_char> *po_value)

{
  functor_type_conflict3 local_40;
  function1<void,_const_std::vector<char,_std::allocator<char>_>_&> local_28;
  
  local_40.this = this;
  std::
  __shared_ptr<VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_40.opt.
                  super___shared_ptr<VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ,&opt->
                   super___shared_ptr<VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                );
  boost::function1<void,std::vector<char,std::allocator<char>>const&>::
  function1<VW::config::options_boost_po::add_notifier<char>(std::shared_ptr<VW::config::typed_option<std::vector<char,std::allocator<char>>>>&,boost::program_options::typed_value<std::vector<char,std::allocator<char>>,char>*)::_lambda(std::vector<char,std::allocator<char>>)_1_>
            ((function1<void,std::vector<char,std::allocator<char>>const&> *)&local_28,&local_40,0);
  boost::function1<void,_const_std::vector<char,_std::allocator<char>_>_&>::operator=
            (&po_value->m_notifier,&local_28);
  boost::function1<void,_const_std::vector<char,_std::allocator<char>_>_&>::~function1(&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.opt.
              super___shared_ptr<VW::config::typed_option<std::vector<char,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return po_value;
}

Assistant:

po::typed_value<std::vector<T>>* options_boost_po::add_notifier(
    std::shared_ptr<typed_option<std::vector<T>>>& opt, po::typed_value<std::vector<T>>* po_value)
{
  return po_value->notifier([this, opt](std::vector<T> final_arguments) {
    // Set the value for the listening location.
    opt->m_location = final_arguments;
    opt->value(final_arguments);
  });
}